

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O3

int __thiscall
gl4cts::TextureParameterQueriesTestCase::init
          (TextureParameterQueriesTestCase *this,EVP_PKEY_CTX *ctx)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  bool bVar2;
  int extraout_EAX;
  int *piVar3;
  iterator iVar4;
  int local_14;
  
  pvVar1 = &this->mSupportedTargets;
  iVar4._M_current =
       (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  piVar3 = (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  if (iVar4._M_current == piVar3) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar4,&local_14);
    iVar4._M_current =
         (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar3 = (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar4._M_current = 0xde1;
    iVar4._M_current = iVar4._M_current + 1;
    (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  if (iVar4._M_current == piVar3) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar4,&local_14);
    iVar4._M_current =
         (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar3 = (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar4._M_current = 0x8c1a;
    iVar4._M_current = iVar4._M_current + 1;
    (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  if (iVar4._M_current == piVar3) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar4,&local_14);
    iVar4._M_current =
         (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar3 = (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar4._M_current = 0x8513;
    iVar4._M_current = iVar4._M_current + 1;
    (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  if (iVar4._M_current == piVar3) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar4,&local_14);
    iVar4._M_current =
         (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar3 = (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar4._M_current = 0x9009;
    iVar4._M_current = iVar4._M_current + 1;
    (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  if (iVar4._M_current == piVar3) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar4,&local_14);
    iVar4._M_current =
         (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar3 = (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar4._M_current = 0x806f;
    iVar4._M_current = iVar4._M_current + 1;
    (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  if (iVar4._M_current == piVar3) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar4,&local_14);
  }
  else {
    *iVar4._M_current = 0x84f5;
    (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current + 1;
  }
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_sparse_texture2");
  pvVar1 = &this->mNotSupportedTargets;
  if (bVar2) {
    iVar4._M_current =
         (this->mNotSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar3 = (this->mNotSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (iVar4._M_current == piVar3) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar4,&local_14);
      iVar4._M_current =
           (this->mNotSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      piVar3 = (this->mNotSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = 0xde0;
      iVar4._M_current = iVar4._M_current + 1;
      (this->mNotSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    if (iVar4._M_current == piVar3) {
LAB_00a4f51f:
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar4,&local_14);
      return extraout_EAX;
    }
    *iVar4._M_current = 0x8c18;
  }
  else {
    iVar4._M_current =
         (this->mNotSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar3 = (this->mNotSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (iVar4._M_current == piVar3) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar4,&local_14);
      iVar4._M_current =
           (this->mNotSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      piVar3 = (this->mNotSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = 0xde0;
      iVar4._M_current = iVar4._M_current + 1;
      (this->mNotSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    if (iVar4._M_current == piVar3) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar4,&local_14);
      iVar4._M_current =
           (this->mNotSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      piVar3 = (this->mNotSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = 0x8c18;
      iVar4._M_current = iVar4._M_current + 1;
      (this->mNotSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    if (iVar4._M_current == piVar3) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar4,&local_14);
      iVar4._M_current =
           (this->mNotSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      piVar3 = (this->mNotSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = 0x9100;
      iVar4._M_current = iVar4._M_current + 1;
      (this->mNotSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    if (iVar4._M_current == piVar3) goto LAB_00a4f51f;
    *iVar4._M_current = 0x9102;
  }
  (this->mNotSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = iVar4._M_current + 1;
  return (int)piVar3;
}

Assistant:

void TextureParameterQueriesTestCase::init()
{
	mSupportedTargets.push_back(GL_TEXTURE_2D);
	mSupportedTargets.push_back(GL_TEXTURE_2D_ARRAY);
	mSupportedTargets.push_back(GL_TEXTURE_CUBE_MAP);
	mSupportedTargets.push_back(GL_TEXTURE_CUBE_MAP_ARRAY);
	mSupportedTargets.push_back(GL_TEXTURE_3D);
	mSupportedTargets.push_back(GL_TEXTURE_RECTANGLE);

	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_sparse_texture2"))
	{
		mNotSupportedTargets.push_back(GL_TEXTURE_1D);
		mNotSupportedTargets.push_back(GL_TEXTURE_1D_ARRAY);
		mNotSupportedTargets.push_back(GL_TEXTURE_2D_MULTISAMPLE);
		mNotSupportedTargets.push_back(GL_TEXTURE_2D_MULTISAMPLE_ARRAY);
	}
	else
	{
		mNotSupportedTargets.push_back(GL_TEXTURE_1D);
		mNotSupportedTargets.push_back(GL_TEXTURE_1D_ARRAY);
	}
}